

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O2

bool bfs_dinic(int s,int t)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  int next;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_88;
  int local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_84 = s;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_84);
  lVar3 = (anonymous_namespace)::dis;
  *(undefined4 *)((anonymous_namespace)::dis + (long)local_84 * 4) = 0;
  do {
    iVar1 = *(int *)(lVar3 + (long)t * 4);
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      bVar5 = iVar1 != -1;
LAB_00111c0f:
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      return bVar5;
    }
    if (iVar1 != -1) {
      bVar5 = true;
      goto LAB_00111c0f;
    }
    iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    lVar3 = (long)iVar1 * 0x18;
    piVar2 = *(int **)((anonymous_namespace)::edges_dup + 8 + lVar3);
    for (piVar4 = *(int **)((anonymous_namespace)::edges_dup + lVar3);
        lVar3 = (anonymous_namespace)::dis, piVar4 != piVar2; piVar4 = piVar4 + 1) {
      local_88 = *(int *)((anonymous_namespace)::edgelist + 4 + (long)*piVar4 * 0x10);
      if ((*(int *)((anonymous_namespace)::dis + (long)local_88 * 4) == -1) &&
         (lVar3 = (anonymous_namespace)::edgelist + (long)*piVar4 * 0x10,
         *(int *)(lVar3 + 0xc) < *(int *)(lVar3 + 8))) {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_88);
        *(int *)((anonymous_namespace)::dis + (long)local_88 * 4) =
             *(int *)((anonymous_namespace)::dis + (long)iVar1 * 4) + 1;
      }
    }
  } while( true );
}

Assistant:

bool bfs_dinic(int s, int t) {
    queue<int> q;
    q.push(s);
    dis[s] = 0;
    
    while (!q.empty() && dis[t] == -1) {
        int v = q.front();
        q.pop();
        
        for (int ind : edges_dup[v]) {
            int next = edgelist[ind].b;
            
            if (dis[next] == -1 && edgelist[ind].flow < edgelist[ind].c) {
                q.push(next);
                dis[next] = dis[v] + 1;
            }
        }
    }
    
    return dis[t] != -1;
}